

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32 drwav_init(drwav *pWav,drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData)

{
  drwav_uint16 dVar1;
  ushort uVar2;
  drwav_bool32 dVar3;
  undefined4 uVar4;
  size_t sVar5;
  long lVar6;
  drwav_uint64 dVar7;
  drwav_container *pdVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  uchar riff [4];
  drwav_uint64 sampleCountFromFactChunk;
  drwav_uint32 sampleCount;
  uchar wave [4];
  drwav_fmt fmt;
  char local_e2;
  char local_e1;
  char local_e0;
  char local_df;
  ushort local_de;
  drwav_uint16 local_dc;
  drwav_uint16 local_da;
  drwav_uint64 *local_d8;
  drwav_container *local_d0;
  ulong local_c8;
  drwav_uint32 local_c0;
  uint local_bc;
  anon_union_16_2_e4b212a4_for_id local_b8;
  ulong local_a8;
  uint local_a0;
  drwav_fmt local_98;
  ulong local_68;
  ulong local_60;
  drwav_uint8 dStack_56;
  drwav_uint8 dStack_55;
  undefined8 uStack_50;
  undefined1 local_48;
  undefined1 uStack_47;
  drwav_uint8 dStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  
  if (onSeek == (drwav_seek_proc)0x0 || onRead == (drwav_read_proc)0x0) {
    return 0;
  }
  memset(pWav,0,0x150);
  sVar5 = (*onRead)(pUserData,&local_e2,4);
  if (sVar5 != 4) {
    return 0;
  }
  if (local_e2 == 'r') {
    if (local_e1 != 'i') {
      return 0;
    }
    if (local_e0 != 'f') {
      return 0;
    }
    if (local_df != 'f') {
      return 0;
    }
    pWav->container = drwav_container_w64;
    sVar5 = (*onRead)(pUserData,&local_98,0xc);
    if (sVar5 != 0xc) {
      return 0;
    }
    lVar6 = 0;
    do {
      if (local_98.subFormat[lVar6 + -0x18] != drwavGUID_W64_RIFF[lVar6 + 4]) {
        return 0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xc);
    local_d0 = &pWav->container;
    if (pWav->container != drwav_container_riff) {
      sVar5 = (*onRead)(pUserData,&local_b8,8);
      if (sVar5 != 8) {
        return 0;
      }
      if (CONCAT44(local_b8._4_4_,local_b8.fourcc) < 0x50) {
        return 0;
      }
      sVar5 = (*onRead)(pUserData,&local_98,0x10);
      if (sVar5 != 0x10) {
        return 0;
      }
      auVar11._0_4_ = -(uint)(CONCAT22(local_98.channels,local_98.formatTag) == 0x65766177);
      auVar11._4_4_ = -(uint)(local_98.sampleRate == 0x11d3acf3);
      auVar11._8_4_ = -(uint)(local_98.avgBytesPerSec == 0xc000d18c);
      auVar11._12_4_ = -(uint)(CONCAT22(local_98.bitsPerSample,local_98.blockAlign) == -0x752471b1);
      uVar4 = movmskps(0x10,auVar11);
      if ((char)uVar4 != '\x0f') {
        return 0;
      }
      pWav->dataChunkDataPos = 0x28;
      goto LAB_00109f7d;
    }
  }
  else {
    if (local_e2 != 'R') {
      return 0;
    }
    if (local_e1 != 'I') {
      return 0;
    }
    if (local_e0 != 'F') {
      return 0;
    }
    if (local_df != 'F') {
      return 0;
    }
    pWav->container = drwav_container_riff;
  }
  local_d0 = &pWav->container;
  sVar5 = (*onRead)(pUserData,&local_98,4);
  if (sVar5 != 4) {
    return 0;
  }
  if (CONCAT22(local_98.channels,local_98.formatTag) < 0x24) {
    return 0;
  }
  sVar5 = (*onRead)(pUserData,&local_b8,4);
  if (sVar5 != 4) {
    return 0;
  }
  if (local_b8.fourcc != (drwav_uint8  [4])0x45564157) {
    return 0;
  }
  pWav->dataChunkDataPos = 0xc;
LAB_00109f7d:
  local_d8 = &pWav->dataChunkDataPos;
  dVar3 = drwav__read_fmt(onRead,onSeek,pUserData,pWav->container,local_d8,&local_98);
  dVar1 = local_98.blockAlign;
  pdVar8 = local_d0;
  if (dVar3 == 0) {
    return 0;
  }
  local_c0 = local_98.sampleRate;
  if ((local_98.blockAlign == 0 || local_98.bitsPerSample == 0) ||
      (local_98.channels == 0 || local_98.sampleRate == 0)) {
    return 0;
  }
  local_dc = local_98.bitsPerSample;
  local_de = local_98.channels;
  local_da = local_98.formatTag;
  if (local_98.formatTag == 0xfffe) {
    local_da = local_98.subFormat._0_2_;
  }
  local_c8 = 0;
  dVar3 = drwav__read_chunk_header
                    (onRead,pUserData,*local_d0,local_d8,(drwav__chunk_header *)&local_b8);
  if (dVar3 != 0) {
    local_68 = (ulong)dVar1;
    local_60 = (ulong)local_de;
    local_48 = 0;
    uStack_47 = 0;
    dStack_46 = 'a';
    uStack_45 = 0x61;
    uStack_44 = 0;
    uStack_43 = 0;
    uStack_42 = 0;
    uStack_41 = 0;
    uStack_40 = 0;
    uStack_3f = 0;
    uStack_3e = 0;
    uStack_3d = 0;
    uStack_3c = 0;
    uStack_3b = 0;
    uStack_3a = 0;
    uStack_39 = 0;
    do {
      uVar9 = local_a8;
      if (*pdVar8 == drwav_container_riff) {
        if (local_b8.fourcc == (drwav_uint8  [4])0x61746164) goto LAB_0010a2da;
        uStack_50 = 0;
        if ((((local_b8.fourcc[0] == 'f') && (local_b8.fourcc[1] == dStack_46)) &&
            (dStack_56 = local_b8.fourcc[2], dStack_56 == 'c')) &&
           (dStack_55 = local_b8.fourcc[3], dStack_55 == 't')) {
          sVar5 = (*onRead)(pUserData,&local_bc,4);
          if (sVar5 != 4) {
            return 0;
          }
          pWav->dataChunkDataPos = pWav->dataChunkDataPos + 4;
          uVar9 = uVar9 - 4;
          local_c8 = (ulong)local_bc;
          if (pWav->translatedFormatTag != 2) {
            local_c8 = 0;
          }
        }
      }
      else {
        if ((local_b8.fourcc == (drwav_uint8  [4])0x61746164) &&
           (local_b8._12_4_ == -0x752471b1 &&
            (local_b8._8_4_ == -0x3fff2e74 && local_b8._4_4_ == 0x11d3acf3))) {
LAB_0010a2da:
          pWav->onRead = onRead;
          pWav->onSeek = onSeek;
          pWav->pUserData = pUserData;
          (pWav->fmt).formatTag = local_98.formatTag;
          (pWav->fmt).channels = local_98.channels;
          (pWav->fmt).sampleRate = local_98.sampleRate;
          (pWav->fmt).avgBytesPerSec = local_98.avgBytesPerSec;
          (pWav->fmt).blockAlign = local_98.blockAlign;
          (pWav->fmt).bitsPerSample = local_98.bitsPerSample;
          (pWav->fmt).extendedSize = local_98.extendedSize;
          (pWav->fmt).validBitsPerSample = local_98.validBitsPerSample;
          (pWav->fmt).channelMask = local_98.channelMask;
          *(ulong *)(pWav->fmt).subFormat =
               CONCAT62(local_98.subFormat._2_6_,local_98.subFormat._0_2_);
          *(undefined8 *)((pWav->fmt).subFormat + 8) = local_98.subFormat._8_8_;
          pWav->sampleRate = local_c0;
          pWav->channels = (ushort)local_60;
          pWav->bitsPerSample = local_dc;
          uVar2 = (ushort)local_68 / (ushort)local_60;
          pWav->bytesPerSample = uVar2;
          pWav->bytesRemaining = local_a8;
          pWav->translatedFormatTag = local_da;
          pWav->dataChunkDataSize = local_a8;
          if ((ushort)local_68 < local_de) {
            return 0;
          }
          if (local_c8 == 0) {
            pWav->totalSampleCount = local_a8 / uVar2;
            if (local_da == 0x11) {
              dVar7 = (local_60 + (long)((int)local_68 + (int)local_60 * -4) * 2) *
                      (local_a8 / local_68);
            }
            else {
              if (local_da != 2) {
                return 1;
              }
              dVar7 = (local_60 * 0x7ffffffffffffffa + local_68) * (local_a8 / local_68) * 2;
            }
            pWav->totalSampleCount = dVar7;
            pWav->bytesPerSample = 0;
          }
          else {
            pWav->totalSampleCount = local_c8 * local_60;
            if ((local_da != 2) && (local_da != 0x11)) {
              return 1;
            }
            pWav->bytesPerSample = 0;
            if ((local_da != 0x11) && (local_da != 2)) {
              return 1;
            }
          }
          if (local_de < 3) {
            return 1;
          }
          return 0;
        }
        if (local_b8._12_4_ == -0x752471b1 &&
            (local_b8._8_4_ == -0x3fff2e74 &&
            (local_b8._4_4_ == 0x11d3acf3 && local_b8.fourcc == (drwav_uint8  [4])0x74636166))) {
          sVar5 = (*onRead)(pUserData,&local_c8,8);
          if (sVar5 != 8) {
            return 0;
          }
          *local_d8 = *local_d8 + 4;
          uVar9 = uVar9 - 8;
        }
      }
      uVar9 = local_a0 + uVar9;
      if (uVar9 != 0) {
        uVar10 = uVar9;
        if (uVar9 >> 0x1f != 0) {
          do {
            dVar3 = (*onSeek)(pUserData,0x7fffffff,drwav_seek_origin_current);
            if (dVar3 == 0) goto LAB_0010a1cd;
            uVar10 = uVar10 - 0x7fffffff;
          } while (0x7fffffff < uVar10);
        }
        (*onSeek)(pUserData,(int)uVar10,drwav_seek_origin_current);
      }
LAB_0010a1cd:
      pdVar8 = local_d0;
      *local_d8 = *local_d8 + uVar9;
      dVar3 = drwav__read_chunk_header
                        (onRead,pUserData,*local_d0,local_d8,(drwav__chunk_header *)&local_b8);
    } while (dVar3 != 0);
  }
  return 0;
}

Assistant:

drwav_bool32 drwav_init(drwav* pWav, drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData) {
    if (onRead == NULL || onSeek == NULL) {
        return DRWAV_FALSE;
    }

    drwav_zero_memory(pWav, sizeof(*pWav));


    // The first 4 bytes should be the RIFF identifier.
    unsigned char riff[4];
    if (onRead(pUserData, riff, sizeof(riff)) != sizeof(riff)) {
        return DRWAV_FALSE;  // Failed to read data.
    }

    // The first 4 bytes can be used to identify the container. For RIFF files it will start with "RIFF" and for
    // w64 it will start with "riff".
    if (drwav__fourcc_equal(riff, "RIFF")) {
        pWav->container = drwav_container_riff;
    } else if (drwav__fourcc_equal(riff, "riff")) {
        pWav->container = drwav_container_w64;

        // Check the rest of the GUID for validity.
        drwav_uint8 riff2[12];
        if (onRead(pUserData, riff2, sizeof(riff2)) != sizeof(riff2)) {
            return DRWAV_FALSE;
        }

        for (int i = 0; i < 12; ++i) {
            if (riff2[i] != drwavGUID_W64_RIFF[i + 4]) {
                return DRWAV_FALSE;
            }
        }
    } else {
        return DRWAV_FALSE;  // Unknown or unsupported container.
    }


    if (pWav->container == drwav_container_riff) {
        // RIFF/WAVE
        unsigned char chunkSizeBytes[4];
        if (onRead(pUserData, chunkSizeBytes, sizeof(chunkSizeBytes)) != sizeof(chunkSizeBytes)) {
            return DRWAV_FALSE;
        }

        unsigned int chunkSize = drwav__bytes_to_u32(chunkSizeBytes);
        if (chunkSize < 36) {
            return DRWAV_FALSE;  // Chunk size should always be at least 36 bytes.
        }

        unsigned char wave[4];
        if (onRead(pUserData, wave, sizeof(wave)) != sizeof(wave)) {
            return DRWAV_FALSE;
        }

        if (!drwav__fourcc_equal(wave, "WAVE")) {
            return DRWAV_FALSE;  // Expecting "WAVE".
        }

        pWav->dataChunkDataPos = 4 + sizeof(chunkSizeBytes) + sizeof(wave);
    } else {
        // W64
        unsigned char chunkSize[8];
        if (onRead(pUserData, chunkSize, sizeof(chunkSize)) != sizeof(chunkSize)) {
            return DRWAV_FALSE;
        }

        if (drwav__bytes_to_u64(chunkSize) < 80) {
            return DRWAV_FALSE;
        }

        drwav_uint8 wave[16];
        if (onRead(pUserData, wave, sizeof(wave)) != sizeof(wave)) {
            return DRWAV_FALSE;
        }

        if (!drwav__guid_equal(wave, drwavGUID_W64_WAVE)) {
            return DRWAV_FALSE;
        }

        pWav->dataChunkDataPos = 16 + sizeof(chunkSize) + sizeof(wave);
    }


    // The next 24 bytes should be the "fmt " chunk.
    drwav_fmt fmt;
    if (!drwav__read_fmt(onRead, onSeek, pUserData, pWav->container, &pWav->dataChunkDataPos, &fmt)) {
        return DRWAV_FALSE;  // Failed to read the "fmt " chunk.
    }

    // Basic validation.
    if (fmt.sampleRate == 0 || fmt.channels == 0 || fmt.bitsPerSample == 0 || fmt.blockAlign == 0) {
        return DRWAV_FALSE;  // Invalid channel count. Probably an invalid WAV file.
    }


    // Translate the internal format.
    unsigned short translatedFormatTag = fmt.formatTag;
    if (translatedFormatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
        translatedFormatTag = drwav__bytes_to_u16(fmt.subFormat + 0);
    }


    drwav_uint64 sampleCountFromFactChunk = 0;

    // The next chunk we care about is the "data" chunk. This is not necessarily the next chunk so we'll need to loop.
    drwav_uint64 dataSize;
    for (;;) {
        drwav__chunk_header header;
        if (!drwav__read_chunk_header(onRead, pUserData, pWav->container, &pWav->dataChunkDataPos, &header)) {
            return DRWAV_FALSE;
        }

        dataSize = header.sizeInBytes;
        if (pWav->container == drwav_container_riff) {
            if (drwav__fourcc_equal(header.id.fourcc, "data")) {
                break;
            }
        } else {
            if (drwav__guid_equal(header.id.guid, drwavGUID_W64_DATA)) {
                break;
            }
        }

        // Optional. Get the total sample count from the FACT chunk. This is useful for compressed formats.
        if (pWav->container == drwav_container_riff) {
            if (drwav__fourcc_equal(header.id.fourcc, "fact")) {
                drwav_uint32 sampleCount;
                if (onRead(pUserData, &sampleCount, 4) != 4) {
                    return DRWAV_FALSE;
                }
                pWav->dataChunkDataPos += 4;
                dataSize -= 4;

                // The sample count in the "fact" chunk is either unreliable, or I'm not understanding it properly. For
                // now I am only enabling this for Microsoft ADPCM formats.
                if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
                    sampleCountFromFactChunk = sampleCount;
                } else {
                    sampleCountFromFactChunk = 0;
                }
            }
        } else {
            if (drwav__guid_equal(header.id.guid, drwavGUID_W64_FACT)) {
                if (onRead(pUserData, &sampleCountFromFactChunk, 8) != 8) {
                    return DRWAV_FALSE;
                }
                pWav->dataChunkDataPos += 4;
                dataSize -= 8;
            }
        }

        // If we get here it means we didn't find the "data" chunk. Seek past it.

        // Make sure we seek past the padding.
        dataSize += header.paddingSize;
        drwav__seek_forward(onSeek, dataSize, pUserData);
        pWav->dataChunkDataPos += dataSize;
    }

    // At this point we should be sitting on the first byte of the raw audio data.

    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    pWav->fmt = fmt;
    pWav->sampleRate = fmt.sampleRate;
    pWav->channels = fmt.channels;
    pWav->bitsPerSample = fmt.bitsPerSample;
    pWav->bytesPerSample = fmt.blockAlign / fmt.channels;
    pWav->bytesRemaining = dataSize;
    pWav->translatedFormatTag = translatedFormatTag;
    pWav->dataChunkDataSize = dataSize;

    // The bytes per sample should never be 0 at this point. This would indicate an invalid WAV file.
    if (pWav->bytesPerSample == 0) {
        return DRWAV_FALSE;
    }

    if (sampleCountFromFactChunk != 0) {
        pWav->totalSampleCount = sampleCountFromFactChunk * fmt.channels;
    } else {
        pWav->totalSampleCount = dataSize / pWav->bytesPerSample;

        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
            drwav_uint64 blockCount = dataSize / fmt.blockAlign;
            pWav->totalSampleCount =
                (blockCount * (fmt.blockAlign - (6 * pWav->channels))) * 2;  // x2 because two samples per byte.
        }
        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
            drwav_uint64 blockCount = dataSize / fmt.blockAlign;
            pWav->totalSampleCount =
                ((blockCount * (fmt.blockAlign - (4 * pWav->channels))) * 2) + (blockCount * pWav->channels);
        }
    }

    // The way we calculate the bytes per sample does not make sense for compressed formats so we just set it to 0.
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        pWav->bytesPerSample = 0;
    }

    // Some formats only support a certain number of channels.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        if (pWav->channels > 2) {
            return DRWAV_FALSE;
        }
    }

#ifdef DR_WAV_LIBSNDFILE_COMPAT
    // I use libsndfile as a benchmark for testing, however in the version I'm using (from the Windows installer on the
    // libsndfile website), it appears the total sample count libsndfile uses for MS-ADPCM is incorrect. It would seem
    // they are computing the total sample count from the number of blocks, however this results in the inclusion of the
    // extra silent samples at the end of the last block. The correct way to know the total sample count is to inspect
    // the "fact" chunk which should always be present for compressed formats, and should always include the sample
    // count. This little block of code below is only used to emulate the libsndfile logic so I can properly run my
    // correctness tests against libsndfile, and is disabled by default.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        drwav_uint64 blockCount = dataSize / fmt.blockAlign;
        pWav->totalSampleCount =
            (blockCount * (fmt.blockAlign - (6 * pWav->channels))) * 2;  // x2 because two samples per byte.
    }
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        drwav_uint64 blockCount = dataSize / fmt.blockAlign;
        pWav->totalSampleCount =
            ((blockCount * (fmt.blockAlign - (4 * pWav->channels))) * 2) + (blockCount * pWav->channels);
    }
#endif

    return DRWAV_TRUE;
}